

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_record.c
# Opt level: O0

int lj_record_mm_lookup(jit_State *J,RecordIndex *ix,MMS mm)

{
  byte bVar1;
  short sVar2;
  ushort uVar3;
  undefined2 uVar4;
  TRef TVar5;
  TRef TVar6;
  cTValue *pcVar7;
  uint in_EDX;
  RecordIndex *in_RSI;
  GCobj *in_RDI;
  cTValue *mo_1;
  GCstr *mmstr;
  TRef tr;
  cTValue *mo;
  int udtype;
  GCtab *mt;
  RecordIndex mix;
  undefined8 in_stack_fffffffffffffd98;
  undefined2 in_stack_fffffffffffffda0;
  undefined2 in_stack_fffffffffffffda2;
  undefined4 in_stack_fffffffffffffda4;
  undefined4 in_stack_fffffffffffffda8;
  IRType in_stack_fffffffffffffdac;
  uint uVar8;
  jit_State *in_stack_fffffffffffffdb0;
  IRType IVar9;
  GCobj *in_stack_fffffffffffffdb8;
  undefined6 in_stack_fffffffffffffdc0;
  undefined2 in_stack_fffffffffffffdc6;
  GCtab *local_200;
  TRef local_1c8;
  GCobj *pGVar10;
  uint local_194;
  
  if ((in_RSI->tab & 0x1f000000) == 0xb000000) {
    local_200 = (GCtab *)(ulong)*(uint *)((ulong)(in_RSI->tabv).u32.lo + 0x10);
    TVar6 = in_RSI->tab;
    *(undefined2 *)((long)in_RDI + 0xa4) = 0x440b;
    *(short *)((long)in_RDI + 0xa0) = (short)TVar6;
    *(undefined2 *)((long)in_RDI + 0xa2) = 5;
    local_1c8 = lj_opt_fold((jit_State *)
                            CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8));
    pGVar10 = in_RDI;
  }
  else {
    if ((in_RSI->tab & 0x1f000000) != 0xc000000) {
      in_stack_fffffffffffffdb0 = (jit_State *)((long)in_RDI + -0xb0);
      if ((in_RSI->tabv).field_2.it < 0xffff0000) {
        uVar8 = 0xd;
      }
      else if ((int)(in_RSI->tabv).field_2.it >> 0xf == -2) {
        uVar8 = 3;
      }
      else {
        uVar8 = (in_RSI->tabv).field_2.it ^ 0xffffffff;
      }
      local_200 = (GCtab *)(ulong)(&(in_stack_fffffffffffffdb0->cur).nextgc)[uVar8 + 0x16].gcptr32;
      if (local_200 == (GCtab *)0x0) {
        in_RSI->mt = 0x7fff;
        return 0;
      }
      if ((in_RSI->tab & 0x1f000000) == 0xa000000) {
LAB_0017cce7:
        IVar9 = (IRType)((ulong)in_stack_fffffffffffffdb0 >> 0x20);
        pcVar7 = lj_tab_getstr(local_200,
                               (GCstr *)(ulong)*(uint *)((long)in_RDI + (ulong)in_EDX * 4 + -0xb0));
        if ((pcVar7 == (cTValue *)0x0) || ((pcVar7->field_2).it == 0xffffffff)) {
          return 0;
        }
        if (((pcVar7->field_2).it != 0xfffffff7) && ((pcVar7->field_2).it != 0xfffffff4)) {
          lj_trace_err((jit_State *)
                       CONCAT44(in_stack_fffffffffffffda4,
                                CONCAT22(in_stack_fffffffffffffda2,in_stack_fffffffffffffda0)),
                       (TraceError)((ulong)in_stack_fffffffffffffd98 >> 0x20));
        }
        (in_RSI->mobjv).field_2 = *(anon_struct_8_2_fd66bcdd_for_TValue_2 *)pcVar7;
        TVar6 = lj_ir_kgc((jit_State *)CONCAT26(in_stack_fffffffffffffdc6,in_stack_fffffffffffffdc0)
                          ,in_stack_fffffffffffffdb8,IVar9);
        in_RSI->mobj = TVar6;
        in_RSI->mtv = local_200;
        in_RSI->mt = 0x7fff;
        return 1;
      }
      TVar6 = lj_ir_kgc((jit_State *)CONCAT26(in_stack_fffffffffffffdc6,in_stack_fffffffffffffdc0),
                        in_stack_fffffffffffffdb8,(IRType)((ulong)in_stack_fffffffffffffdb0 >> 0x20)
                       );
      IVar9 = (IRType)((ulong)in_stack_fffffffffffffdb0 >> 0x20);
      in_RSI->mt = TVar6;
      goto LAB_0017d0d0;
    }
    bVar1 = *(byte *)((ulong)(in_RSI->tabv).u32.lo + 6);
    local_200 = (GCtab *)(ulong)*(uint *)((ulong)(in_RSI->tabv).u32.lo + 0x10);
    if (1 < bVar1) {
      if (bVar1 == 2) {
        TVar6 = in_RSI->tab;
        pGVar10 = in_RDI;
        TVar5 = lj_ir_kptr_((jit_State *)
                            CONCAT26(in_stack_fffffffffffffdc6,in_stack_fffffffffffffdc0),
                            (IROp)((ulong)in_stack_fffffffffffffdb8 >> 0x20),
                            in_stack_fffffffffffffdb0);
        *(undefined2 *)((long)in_RDI + 0xa4) = 0x885;
        *(short *)((long)in_RDI + 0xa0) = (short)TVar6;
        *(short *)((long)in_RDI + 0xa2) = (short)TVar5;
        lj_opt_fold((jit_State *)CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8));
        in_RDI = pGVar10;
      }
      else {
        TVar6 = in_RSI->tab;
        *(undefined2 *)((long)in_RDI + 0xa4) = 0x4410;
        *(short *)((long)in_RDI + 0xa0) = (short)TVar6;
        *(undefined2 *)((long)in_RDI + 0xa2) = 0xc;
        in_stack_fffffffffffffdb8 = in_RDI;
        TVar6 = lj_opt_fold((jit_State *)
                            CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8));
        in_stack_fffffffffffffdc6 = (undefined2)TVar6;
        in_RDI = in_stack_fffffffffffffdb8;
        TVar6 = lj_ir_kint(in_stack_fffffffffffffdb0,in_stack_fffffffffffffdac);
        *(undefined2 *)((long)in_stack_fffffffffffffdb8 + 0xa4) = 0x893;
        *(undefined2 *)((long)in_stack_fffffffffffffdb8 + 0xa0) = in_stack_fffffffffffffdc6;
        *(short *)((long)in_stack_fffffffffffffdb8 + 0xa2) = (short)TVar6;
        lj_opt_fold((jit_State *)CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8));
      }
      goto LAB_0017cce7;
    }
    TVar6 = in_RSI->tab;
    *(undefined2 *)((long)in_RDI + 0xa4) = 0x440b;
    *(short *)((long)in_RDI + 0xa0) = (short)TVar6;
    *(undefined2 *)((long)in_RDI + 0xa2) = 0xb;
    local_1c8 = lj_opt_fold((jit_State *)
                            CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8));
    pGVar10 = in_RDI;
  }
  TVar6 = local_1c8;
  if (local_200 == (GCtab *)0x0) {
    TVar6 = 0x7fff;
  }
  in_RSI->mt = TVar6;
  sVar2 = 8;
  if (local_200 != (GCtab *)0x0) {
    sVar2 = 9;
  }
  uVar3 = sVar2 << 8 | 0x8b;
  uVar4 = (undefined2)local_1c8;
  in_RDI = pGVar10;
  TVar6 = lj_ir_knull(in_stack_fffffffffffffdb0,in_stack_fffffffffffffdac);
  IVar9 = (IRType)((ulong)in_stack_fffffffffffffdb0 >> 0x20);
  *(ushort *)((long)pGVar10 + 0xa4) = uVar3;
  *(undefined2 *)((long)pGVar10 + 0xa0) = uVar4;
  *(short *)((long)pGVar10 + 0xa2) = (short)TVar6;
  lj_opt_fold((jit_State *)CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8));
LAB_0017d0d0:
  if (local_200 == (GCtab *)0x0) {
    local_194 = 0;
  }
  else {
    pcVar7 = lj_tab_getstr(local_200,
                           (GCstr *)(ulong)*(uint *)((long)in_RDI + (ulong)in_EDX * 4 + -0xb0));
    if ((pcVar7 != (cTValue *)0x0) && ((pcVar7->field_2).it != 0xffffffff)) {
      (in_RSI->mobjv).field_2 = (anon_struct_8_2_fd66bcdd_for_TValue_2)*pcVar7;
    }
    in_RSI->mtv = local_200;
    lj_ir_kgc((jit_State *)CONCAT26(in_stack_fffffffffffffdc6,in_stack_fffffffffffffdc0),
              in_stack_fffffffffffffdb8,IVar9);
    TVar6 = lj_record_idx((jit_State *)&in_RDI->gch,in_RSI);
    in_RSI->mobj = TVar6;
    local_194 = (uint)(((in_RSI->mobj & 0x1f000000) == 0 ^ 0xffU) & 1);
  }
  return local_194;
}

Assistant:

int lj_record_mm_lookup(jit_State *J, RecordIndex *ix, MMS mm)
{
  RecordIndex mix;
  GCtab *mt;
  if (tref_istab(ix->tab)) {
    mt = tabref(tabV(&ix->tabv)->metatable);
    mix.tab = emitir(IRT(IR_FLOAD, IRT_TAB), ix->tab, IRFL_TAB_META);
  } else if (tref_isudata(ix->tab)) {
    int udtype = udataV(&ix->tabv)->udtype;
    mt = tabref(udataV(&ix->tabv)->metatable);
    /* The metatables of special userdata objects are treated as immutable. */
    if (udtype > UDTYPE_IO_FILE) {
      cTValue *mo;
      if (LJ_HASFFI && udtype == UDTYPE_FFI_CLIB) {
	/* Specialize to the C library namespace object. */
	emitir(IRTG(IR_EQ, IRT_PGC), ix->tab, lj_ir_kptr(J, udataV(&ix->tabv)));
      } else {
	/* Specialize to the type of userdata. */
	TRef tr = emitir(IRT(IR_FLOAD, IRT_U8), ix->tab, IRFL_UDATA_UDTYPE);
	emitir(IRTGI(IR_EQ), tr, lj_ir_kint(J, udtype));
      }
  immutable_mt:
      mo = lj_tab_getstr(mt, mmname_str(J2G(J), mm));
      if (!mo || tvisnil(mo))
	return 0;  /* No metamethod. */
      /* Treat metamethod or index table as immutable, too. */
      if (!(tvisfunc(mo) || tvistab(mo)))
	lj_trace_err(J, LJ_TRERR_BADTYPE);
      copyTV(J->L, &ix->mobjv, mo);
      ix->mobj = lj_ir_kgc(J, gcV(mo), tvisfunc(mo) ? IRT_FUNC : IRT_TAB);
      ix->mtv = mt;
      ix->mt = TREF_NIL;  /* Dummy value for comparison semantics. */
      return 1;  /* Got metamethod or index table. */
    }
    mix.tab = emitir(IRT(IR_FLOAD, IRT_TAB), ix->tab, IRFL_UDATA_META);
  } else {
    /* Specialize to base metatable. Must flush mcode in lua_setmetatable(). */
    mt = tabref(basemt_obj(J2G(J), &ix->tabv));
    if (mt == NULL) {
      ix->mt = TREF_NIL;
      return 0;  /* No metamethod. */
    }
    /* The cdata metatable is treated as immutable. */
    if (LJ_HASFFI && tref_iscdata(ix->tab)) goto immutable_mt;
#if LJ_GC64
    /* TODO: fix ARM32 asm_fload(), so we can use this for all archs. */
    ix->mt = mix.tab = lj_ir_ggfload(J, IRT_TAB,
      GG_OFS(g.gcroot[GCROOT_BASEMT+itypemap(&ix->tabv)]));
#else
    ix->mt = mix.tab = lj_ir_ktab(J, mt);
#endif
    goto nocheck;
  }
  ix->mt = mt ? mix.tab : TREF_NIL;
  emitir(IRTG(mt ? IR_NE : IR_EQ, IRT_TAB), mix.tab, lj_ir_knull(J, IRT_TAB));
nocheck:
  if (mt) {
    GCstr *mmstr = mmname_str(J2G(J), mm);
    cTValue *mo = lj_tab_getstr(mt, mmstr);
    if (mo && !tvisnil(mo))
      copyTV(J->L, &ix->mobjv, mo);
    ix->mtv = mt;
    settabV(J->L, &mix.tabv, mt);
    setstrV(J->L, &mix.keyv, mmstr);
    mix.key = lj_ir_kstr(J, mmstr);
    mix.val = 0;
    mix.idxchain = 0;
    ix->mobj = lj_record_idx(J, &mix);
    return !tref_isnil(ix->mobj);  /* 1 if metamethod found, 0 if not. */
  }
  return 0;  /* No metamethod. */
}